

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

csc * csc_spalloc(c_int m,c_int n,c_int nzmax,c_int values,c_int triplet)

{
  csc *A;
  c_int *pcVar1;
  c_int *pcVar2;
  c_float *pcVar3;
  long lVar4;
  long lVar5;
  
  A = (csc *)calloc(1,0x38);
  if (A != (csc *)0x0) {
    A->m = m;
    A->n = n;
    lVar5 = 1;
    if (1 < nzmax) {
      lVar5 = nzmax;
    }
    A->nzmax = lVar5;
    lVar4 = n + 1;
    if (triplet != 0) {
      lVar4 = lVar5;
    }
    A->nz = -(ulong)(triplet == 0);
    pcVar1 = (c_int *)malloc(lVar4 << 3);
    A->p = pcVar1;
    pcVar2 = (c_int *)malloc(lVar5 << 3);
    A->i = pcVar2;
    if (values == 0) {
      pcVar3 = (c_float *)0x0;
    }
    else {
      pcVar3 = (c_float *)malloc(lVar5 << 3);
    }
    A->x = pcVar3;
    if (((pcVar1 != (c_int *)0x0) && (pcVar2 != (c_int *)0x0)) &&
       (values == 0 || pcVar3 != (c_float *)0x0)) {
      return A;
    }
    csc_spfree(A);
  }
  return (csc *)0x0;
}

Assistant:

csc* csc_spalloc(c_int m, c_int n, c_int nzmax, c_int values, c_int triplet) {
  csc *A = csc_calloc(1, sizeof(csc)); /* allocate the csc struct */

  if (!A) return OSQP_NULL;            /* out of memory */

  A->m     = m;                        /* define dimensions and nzmax */
  A->n     = n;
  A->nzmax = nzmax = c_max(nzmax, 1);
  A->nz    = triplet ? 0 : -1;         /* allocate triplet or comp.col */
  A->p     = csc_malloc(triplet ? nzmax : n + 1, sizeof(c_int));
  A->i     = csc_malloc(nzmax,  sizeof(c_int));
  A->x     = values ? csc_malloc(nzmax,  sizeof(c_float)) : OSQP_NULL;
  if (!A->p || !A->i || (values && !A->x)){
    csc_spfree(A);
    return OSQP_NULL;
  } else return A;
}